

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O3

void __thiscall hrgls::datablob::DataBlob::DataBlob(DataBlob *this,DataBlob *copy)

{
  DataBlob_private *pDVar1;
  hrgls_Status hVar2;
  DataBlob_private *pDVar3;
  hrgls_DataBlob phVar4;
  
  this->m_private = (DataBlob_private *)0x0;
  pDVar3 = (DataBlob_private *)operator_new(0x10);
  pDVar3->blob = (hrgls_DataBlob)0x0;
  *(undefined8 *)&pDVar3->status = 0;
  this->m_private = pDVar3;
  pDVar1 = copy->m_private;
  phVar4 = (hrgls_DataBlob)0x0;
  if (pDVar1 != (DataBlob_private *)0x0) {
    phVar4 = pDVar1->blob;
    hVar2 = 0;
    if (phVar4 == (hrgls_DataBlob)0x0) {
      hVar2 = 0x3ee;
    }
    pDVar1->status = hVar2;
  }
  hVar2 = hrgls_DataBlobCopy(pDVar3,phVar4);
  this->m_private->status = hVar2;
  return;
}

Assistant:

DataBlob::DataBlob(const DataBlob&copy)
    {
      m_private = new DataBlob_private();
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, copy.RawDataBlob());
    }